

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManConstructQuantCubeIntern(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace,int fBackward)

{
  DdManager *pDVar1;
  abctime aVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  DdNode *pDVar6;
  int iVar7;
  DdNode *local_40;
  
  pDVar1 = p->dd;
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  local_40 = Cudd_ReadOne(pDVar1);
  Cudd_Ref(local_40);
  for (iVar7 = 0; iVar7 < pGroup->vIns->nSize; iVar7 = iVar7 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,iVar7);
    if (fBackward == 0) {
LAB_0069202a:
      iVar3 = Vec_IntEntry(p->vVarBegs,pAVar5->Id);
      iVar4 = Vec_IntEntry(p->vVarEnds,pAVar5->Id);
      if (iVar4 < iVar3) {
        __assert_fail("iGroupFirst <= iGroupLast",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                      ,0xa9,
                      "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)")
        ;
      }
      if (iVar4 <= iVar3) {
        pDVar1 = p->dd;
        iVar3 = Vec_IntEntry(p->vObj2Var,pAVar5->Id);
        pDVar6 = Cudd_bddIthVar(pDVar1,iVar3);
        pDVar6 = Cudd_bddAnd(p->dd,local_40,pDVar6);
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(p->dd,local_40);
        local_40 = pDVar6;
      }
    }
    else {
      iVar3 = Saig_ObjIsPi(p->pAig,pAVar5);
      if (iVar3 == 0) goto LAB_0069202a;
    }
  }
  iVar7 = 0;
  do {
    if (pGroup->vOuts->nSize <= iVar7) {
      Cudd_Deref(local_40);
      p->dd->TimeStop = aVar2;
      return local_40;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,iVar7);
    if (fBackward == 0) {
LAB_006920d5:
      iVar3 = Vec_IntEntry(p->vVarBegs,pAVar5->Id);
      iVar4 = Vec_IntEntry(p->vVarEnds,pAVar5->Id);
      if (iVar4 < iVar3) {
        __assert_fail("iGroupFirst <= iGroupLast",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                      ,0xb6,
                      "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)")
        ;
      }
      if (iVar4 <= iVar3) {
        pDVar1 = p->dd;
        iVar3 = Vec_IntEntry(p->vObj2Var,pAVar5->Id);
        pDVar6 = Cudd_bddIthVar(pDVar1,iVar3);
        pDVar6 = Cudd_bddAnd(p->dd,local_40,pDVar6);
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(p->dd,local_40);
        local_40 = pDVar6;
      }
    }
    else {
      iVar3 = Saig_ObjIsPi(p->pAig,pAVar5);
      if (iVar3 == 0) goto LAB_006920d5;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

DdNode * Llb_ManConstructQuantCubeIntern( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace, int fBackward )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupFirst, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}